

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Msg.cpp
# Opt level: O3

Msg * __thiscall util::logging::Msg::operator+(Msg *__return_storage_ptr__,Msg *this,string *val)

{
  M_Level MVar1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50;
  long local_48;
  long local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  pcVar2 = (this->msg_txt)._M_dataplus._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + (this->msg_txt)._M_string_length);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)local_70,(ulong)(val->_M_dataplus)._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_40 = *plVar4;
    uStack_38 = (undefined4)plVar3[3];
    uStack_34 = *(undefined4 *)((long)plVar3 + 0x1c);
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  MVar1 = this->msg_lvl;
  __return_storage_ptr__->_vptr_Msg = (_func_int **)&PTR__Msg_0011dbb0;
  (__return_storage_ptr__->msg_txt)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->msg_txt).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->msg_txt,local_50,local_48 + (long)local_50);
  __return_storage_ptr__->msg_lvl = MVar1;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

Msg Msg::operator+( const std::string & val)
		{
			return Msg(getMsg_txt() + val, getMsg_lvl());
		}